

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

znzFile nifti_write_ascii_image
                  (nifti_image *nim,nifti_brick_list *NBL,char *opts,int write_data,int leave_open)

{
  char *path;
  char *mode;
  int use_compression;
  char *str;
  char *hstr;
  znzFile fp;
  int leave_open_local;
  int write_data_local;
  char *opts_local;
  nifti_brick_list *NBL_local;
  nifti_image *nim_local;
  
  fp._0_4_ = leave_open;
  fp._4_4_ = write_data;
  _leave_open_local = opts;
  opts_local = (char *)NBL;
  NBL_local = (nifti_brick_list *)nim;
  str = nifti_image_to_ascii(nim);
  mode = _leave_open_local;
  if (str == (char *)0x0) {
    fprintf(_stderr,"** failed image_to_ascii()\n");
    nim_local = (nifti_image *)0x0;
  }
  else {
    path = (char *)NBL_local[0x1a].bsize;
    use_compression = nifti_is_gzfile((char *)NBL_local[0x1a].bsize);
    hstr = (char *)znzopen(path,mode,use_compression);
    if ((znzFile)hstr == (znzFile)0x0) {
      free(str);
      fprintf(_stderr,"** failed to open \'%s\' for ascii write\n",NBL_local[0x1a].bsize);
      nim_local = (nifti_image *)hstr;
    }
    else {
      znzputs(str,(znzFile)hstr);
      nifti_write_extensions((znzFile)hstr,(nifti_image *)NBL_local);
      if (fp._4_4_ != 0) {
        nifti_write_all_data((znzFile)hstr,(nifti_image *)NBL_local,(nifti_brick_list *)opts_local);
      }
      if ((int)fp == 0) {
        Xznzclose((znzFile *)&hstr);
      }
      free(str);
      nim_local = (nifti_image *)hstr;
    }
  }
  return (znzFile)nim_local;
}

Assistant:

znzFile nifti_write_ascii_image(nifti_image *nim, const nifti_brick_list * NBL,
                              const char *opts, int write_data, int leave_open)
{
   znzFile   fp;
   char    * hstr;

   hstr = nifti_image_to_ascii( nim ) ;  /* get header in ASCII form */
   if( ! hstr ){ fprintf(stderr,"** failed image_to_ascii()\n"); return NULL; }

   fp = znzopen( nim->fname , opts , nifti_is_gzfile(nim->fname) ) ;
   if( znz_isnull(fp) ){
      free(hstr);
      fprintf(stderr,"** failed to open '%s' for ascii write\n",nim->fname);
      return fp;
   }

   znzputs(hstr,fp);                                               /* header */
   nifti_write_extensions(fp,nim);                             /* extensions */

   if ( write_data   ) { nifti_write_all_data(fp,nim,NBL); }         /* data */
   if ( ! leave_open ) { znzclose(fp); }
   free(hstr);
   return fp;  /* returned but may be closed */
}